

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Postprocess.cpp
# Opt level: O1

void __thiscall
Assimp::X3DImporter::Postprocess_BuildMesh
          (X3DImporter *this,CX3DImporter_NodeElement *pNodeElement,aiMesh **pMesh)

{
  vector<int,_std::allocator<int>_> *pvVar1;
  size_t *psVar2;
  int iVar3;
  CX3DImporter_NodeElement *pCVar4;
  CX3DImporter_NodeElement *pCVar5;
  aiMesh *paVar6;
  _List_node_base *p_Var7;
  runtime_error *prVar8;
  long *plVar9;
  pointer paVar10;
  _List_node_base *p_Var11;
  _List_node_base *p_Var12;
  CX3DImporter_NodeElement_Geometry2D *tnemesh;
  list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_> *plVar13;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> tarr;
  undefined1 local_b8 [24];
  long lStack_a0;
  EType *local_90;
  list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_> *local_88;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  size_type *local_40;
  CX3DImporter_NodeElement *local_38;
  
  if (pMesh == (aiMesh **)0x0) {
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_b8._0_8_ = local_b8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_b8,"Postprocess_BuildMesh. pMesh is nullptr.","");
    std::runtime_error::runtime_error(prVar8,(string *)local_b8);
    *(undefined ***)prVar8 = &PTR__runtime_error_00900168;
    __cxa_throw(prVar8,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  if (*pMesh != (aiMesh *)0x0) {
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_b8._0_8_ = local_b8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_b8,"Postprocess_BuildMesh. *pMesh must be nullptr.","");
    std::runtime_error::runtime_error(prVar8,(string *)local_b8);
    *(undefined ***)prVar8 = &PTR__runtime_error_00900168;
    __cxa_throw(prVar8,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  switch(pNodeElement->Type) {
  case ENET_Arc2D:
  case ENET_ArcClose2D:
  case ENET_Circle2D:
  case ENET_Disk2D:
  case ENET_Polyline2D:
  case ENET_Polypoint2D:
  case ENET_Rectangle2D:
  case ENET_TriangleSet2D:
    local_b8._0_8_ = (pointer)0x0;
    local_b8._8_8_ = (aiVector3t<float> *)0x0;
    local_b8._16_8_ = (aiVector3t<float> *)0x0;
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
              ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_b8,
               (size_type)pNodeElement[1].ID._M_dataplus._M_p);
    for (pCVar4 = (CX3DImporter_NodeElement *)pNodeElement[1]._vptr_CX3DImporter_NodeElement;
        pCVar4 != pNodeElement + 1;
        pCVar4 = (CX3DImporter_NodeElement *)pCVar4->_vptr_CX3DImporter_NodeElement) {
      if (local_b8._8_8_ == local_b8._16_8_) {
        std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
        _M_realloc_insert<aiVector3t<float>const&>
                  ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)local_b8,
                   (iterator)local_b8._8_8_,(aiVector3t<float> *)&pCVar4->ID);
      }
      else {
        ((aiVector3t<float> *)local_b8._8_8_)->z = *(float *)&(pCVar4->ID)._M_string_length;
        *(pointer *)local_b8._8_8_ = (pCVar4->ID)._M_dataplus._M_p;
        local_b8._8_8_ = local_b8._8_8_ + 0xc;
      }
    }
    paVar6 = StandardShapes::MakeMesh
                       ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_b8,
                        (uint)pNodeElement[1].ID._M_string_length);
    goto LAB_00632998;
  case ENET_Box:
  case ENET_Cone:
  case ENET_Cylinder:
  case ENET_Sphere:
    local_b8._0_8_ = (pointer)0x0;
    local_b8._8_8_ = (aiVector3t<float> *)0x0;
    local_b8._16_8_ = (aiVector3t<float> *)0x0;
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
              ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_b8,
               (size_type)pNodeElement[1].ID._M_dataplus._M_p);
    for (pCVar4 = (CX3DImporter_NodeElement *)pNodeElement[1]._vptr_CX3DImporter_NodeElement;
        pCVar4 != pNodeElement + 1;
        pCVar4 = (CX3DImporter_NodeElement *)pCVar4->_vptr_CX3DImporter_NodeElement) {
      if (local_b8._8_8_ == local_b8._16_8_) {
        std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
        _M_realloc_insert<aiVector3t<float>const&>
                  ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)local_b8,
                   (iterator)local_b8._8_8_,(aiVector3t<float> *)&pCVar4->ID);
      }
      else {
        ((aiVector3t<float> *)local_b8._8_8_)->z = *(float *)&(pCVar4->ID)._M_string_length;
        *(pointer *)local_b8._8_8_ = (pCVar4->ID)._M_dataplus._M_p;
        local_b8._8_8_ = local_b8._8_8_ + 0xc;
      }
    }
    paVar6 = StandardShapes::MakeMesh
                       ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_b8,
                        (uint)pNodeElement[1].ID._M_string_length);
LAB_00632998:
    *pMesh = paVar6;
    if ((pointer)local_b8._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_b8._0_8_);
    }
    break;
  case ENET_ElevationGrid:
    paVar6 = GeometryHelper_MakeMesh
                       (this,(vector<int,_std::allocator<int>_> *)
                             ((long)&pNodeElement[1].ID.field_2 + 8),
                        (list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                        (pNodeElement + 1));
    *pMesh = paVar6;
    for (p_Var12 = (pNodeElement->Child).
                   super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                   ._M_impl._M_node.super__List_node_base._M_next;
        p_Var12 != (_List_node_base *)&pNodeElement->Child; p_Var12 = p_Var12->_M_next) {
      p_Var7 = p_Var12[1]._M_next;
      iVar3 = *(int *)&p_Var7->_M_prev;
      if (iVar3 < 0x22) {
        if (iVar3 == 0x16) {
          MeshGeometry_AddNormal
                    (this,*pMesh,
                     (list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)(p_Var7 + 5),
                     (bool)pNodeElement[1].ID.field_2._M_local_buf[1]);
        }
        else {
          if (iVar3 != 0x17) {
LAB_00633614:
            prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
            to_string<CX3DImporter_NodeElement::EType>
                      (&local_80,*(EType *)&(p_Var12[1]._M_next)->_M_prev);
            std::operator+(&local_60,"Postprocess_BuildMesh. Unknown child of ElevationGrid: ",
                           &local_80);
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_60);
            local_b8._0_8_ = *plVar9;
            paVar10 = (pointer)(plVar9 + 2);
            if ((pointer)local_b8._0_8_ == paVar10) {
              local_b8._16_8_ = *(undefined8 *)paVar10;
              lStack_a0 = plVar9[3];
              local_b8._0_8_ = (pointer)(local_b8 + 0x10);
            }
            else {
              local_b8._16_8_ = *(undefined8 *)paVar10;
            }
            local_b8._8_8_ = plVar9[1];
            *plVar9 = (long)paVar10;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            std::runtime_error::runtime_error(prVar8,(string *)local_b8);
            *(undefined ***)prVar8 = &PTR__runtime_error_00900168;
            __cxa_throw(prVar8,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          MeshGeometry_AddTexCoord
                    (this,*pMesh,
                     (list<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)(p_Var7 + 5));
        }
      }
      else if (iVar3 == 0x23) {
        MeshGeometry_AddColor
                  (this,*pMesh,
                   (list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)(p_Var7 + 5),
                   (bool)pNodeElement[1].ID.field_2._M_local_buf[2]);
      }
      else {
        if (iVar3 != 0x22) goto LAB_00633614;
        MeshGeometry_AddColor
                  (this,*pMesh,(list<aiColor3D,_std::allocator<aiColor3D>_> *)(p_Var7 + 5),
                   (bool)pNodeElement[1].ID.field_2._M_local_buf[2]);
      }
    }
    break;
  case ENET_Extrusion:
    paVar6 = GeometryHelper_MakeMesh
                       (this,(vector<int,_std::allocator<int>_> *)
                             &pNodeElement[1].Child.
                              super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                              ._M_impl._M_node._M_size,
                        (list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                        (pNodeElement + 1));
    *pMesh = paVar6;
    break;
  default:
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    to_string<CX3DImporter_NodeElement::EType>(&local_80,pNodeElement->Type);
    std::operator+(&local_60,"Postprocess_BuildMesh. Unknown mesh type: ",&local_80);
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_60);
    local_b8._0_8_ = *plVar9;
    paVar10 = (pointer)(plVar9 + 2);
    if ((pointer)local_b8._0_8_ == paVar10) {
      local_b8._16_8_ = *(undefined8 *)paVar10;
      lStack_a0 = plVar9[3];
      local_b8._0_8_ = (pointer)(local_b8 + 0x10);
    }
    else {
      local_b8._16_8_ = *(undefined8 *)paVar10;
    }
    local_b8._8_8_ = plVar9[1];
    *plVar9 = (long)paVar10;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    std::runtime_error::runtime_error(prVar8,(string *)local_b8);
    *(undefined ***)prVar8 = &PTR__runtime_error_00900168;
    __cxa_throw(prVar8,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  case ENET_IndexedFaceSet:
    plVar13 = &pNodeElement->Child;
    p_Var12 = (pNodeElement->Child).
              super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
              ._M_impl._M_node.super__List_node_base._M_next;
    if (p_Var12 != (_List_node_base *)plVar13) {
      do {
        if (*(int *)&(p_Var12[1]._M_next)->_M_prev == 0x15) {
          paVar6 = GeometryHelper_MakeMesh
                             (this,(vector<int,_std::allocator<int>_> *)
                                   &pNodeElement[1].Child.
                                    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                                    ._M_impl._M_node._M_size,
                              (list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                              (p_Var12[1]._M_next + 5));
          *pMesh = paVar6;
        }
        p_Var12 = p_Var12->_M_next;
      } while (p_Var12 != (_List_node_base *)plVar13);
    }
    p_Var12 = (plVar13->
              super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
              )._M_impl._M_node.super__List_node_base._M_next;
    if (p_Var12 != (_List_node_base *)plVar13) {
      psVar2 = &pNodeElement[1].Child.
                super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                ._M_impl._M_node._M_size;
      local_88 = &pNodeElement[2].Child;
      local_40 = &pNodeElement[2].ID._M_string_length;
      local_90 = (EType *)((long)&pNodeElement[1].ID.field_2 + 8);
      do {
        p_Var7 = p_Var12[1]._M_next;
        iVar3 = *(int *)&p_Var7->_M_prev;
        if (iVar3 < 0x17) {
          if (iVar3 != 0x15) {
            if (iVar3 != 0x16) {
LAB_00633682:
              prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
              to_string<CX3DImporter_NodeElement::EType>
                        (&local_80,*(EType *)&(p_Var12[1]._M_next)->_M_prev);
              std::operator+(&local_60,"Postprocess_BuildMesh. Unknown child of IndexedFaceSet: ",
                             &local_80);
              plVar9 = (long *)std::__cxx11::string::append((char *)&local_60);
              local_b8._0_8_ = *plVar9;
              paVar10 = (pointer)(plVar9 + 2);
              if ((pointer)local_b8._0_8_ == paVar10) {
                local_b8._16_8_ = *(undefined8 *)paVar10;
                lStack_a0 = plVar9[3];
                local_b8._0_8_ = (pointer)(local_b8 + 0x10);
              }
              else {
                local_b8._16_8_ = *(undefined8 *)paVar10;
              }
              local_b8._8_8_ = plVar9[1];
              *plVar9 = (long)paVar10;
              plVar9[1] = 0;
              *(undefined1 *)(plVar9 + 2) = 0;
              std::runtime_error::runtime_error(prVar8,(string *)local_b8);
              *(undefined ***)prVar8 = &PTR__runtime_error_00900168;
              __cxa_throw(prVar8,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
            }
            MeshGeometry_AddNormal
                      (this,*pMesh,(vector<int,_std::allocator<int>_> *)psVar2,
                       (vector<int,_std::allocator<int>_> *)local_40,
                       (list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)(p_Var7 + 5),
                       *(bool *)&pNodeElement[2].Parent);
          }
        }
        else if (iVar3 == 0x17) {
          MeshGeometry_AddTexCoord
                    (this,*pMesh,(vector<int,_std::allocator<int>_> *)psVar2,
                     (vector<int,_std::allocator<int>_> *)local_88,
                     (list<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)(p_Var7 + 5));
        }
        else if (iVar3 == 0x23) {
          MeshGeometry_AddColor
                    (this,*pMesh,(vector<int,_std::allocator<int>_> *)psVar2,
                     (vector<int,_std::allocator<int>_> *)local_90,
                     (list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)(p_Var7 + 5),
                     *(bool *)&pNodeElement[1].Child.
                               super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                               ._M_impl._M_node.super__List_node_base._M_prev);
        }
        else {
          if (iVar3 != 0x22) goto LAB_00633682;
          MeshGeometry_AddColor
                    (this,*pMesh,(vector<int,_std::allocator<int>_> *)psVar2,
                     (vector<int,_std::allocator<int>_> *)local_90,
                     (list<aiColor3D,_std::allocator<aiColor3D>_> *)(p_Var7 + 5),
                     *(bool *)&pNodeElement[1].Child.
                               super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                               ._M_impl._M_node.super__List_node_base._M_prev);
        }
        p_Var12 = p_Var12->_M_next;
      } while (p_Var12 != (_List_node_base *)plVar13);
    }
    break;
  case ENET_IndexedLineSet:
    plVar13 = &pNodeElement->Child;
    p_Var12 = (pNodeElement->Child).
              super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
              ._M_impl._M_node.super__List_node_base._M_next;
    if (p_Var12 != (_List_node_base *)plVar13) {
      do {
        if (*(int *)&(p_Var12[1]._M_next)->_M_prev == 0x15) {
          paVar6 = GeometryHelper_MakeMesh
                             (this,(vector<int,_std::allocator<int>_> *)
                                   &pNodeElement[1].Child.
                                    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                                    ._M_impl._M_node._M_size,
                              (list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                              (p_Var12[1]._M_next + 5));
          *pMesh = paVar6;
        }
        p_Var12 = p_Var12->_M_next;
      } while (p_Var12 != (_List_node_base *)plVar13);
    }
    p_Var12 = (plVar13->
              super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
              )._M_impl._M_node.super__List_node_base._M_next;
    if (p_Var12 != (_List_node_base *)plVar13) {
      local_90 = (EType *)&pNodeElement[1].Child.
                           super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                           ._M_impl._M_node._M_size;
      pvVar1 = (vector<int,_std::allocator<int>_> *)((long)&pNodeElement[1].ID.field_2 + 8);
      do {
        paVar6 = *pMesh;
        if (paVar6 == (aiMesh *)0x0) {
          __assert_fail("*pMesh",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/X3D/X3DImporter_Postprocess.cpp"
                        ,0x16a,
                        "void Assimp::X3DImporter::Postprocess_BuildMesh(const CX3DImporter_NodeElement &, aiMesh **) const"
                       );
        }
        p_Var7 = p_Var12[1]._M_next;
        iVar3 = *(int *)&p_Var7->_M_prev;
        if (iVar3 != 0x15) {
          if (iVar3 == 0x23) {
            MeshGeometry_AddColor
                      (this,paVar6,(vector<int,_std::allocator<int>_> *)local_90,pvVar1,
                       (list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)(p_Var7 + 5),
                       *(bool *)&pNodeElement[1].Child.
                                 super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                                 ._M_impl._M_node.super__List_node_base._M_prev);
          }
          else {
            if (iVar3 != 0x22) {
              prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
              to_string<CX3DImporter_NodeElement::EType>
                        (&local_80,*(EType *)&(p_Var12[1]._M_next)->_M_prev);
              std::operator+(&local_60,"Postprocess_BuildMesh. Unknown child of IndexedLineSet: ",
                             &local_80);
              plVar9 = (long *)std::__cxx11::string::append((char *)&local_60);
              local_b8._0_8_ = *plVar9;
              paVar10 = (pointer)(plVar9 + 2);
              if ((pointer)local_b8._0_8_ == paVar10) {
                local_b8._16_8_ = *(undefined8 *)paVar10;
                lStack_a0 = plVar9[3];
                local_b8._0_8_ = (pointer)(local_b8 + 0x10);
              }
              else {
                local_b8._16_8_ = *(undefined8 *)paVar10;
              }
              local_b8._8_8_ = plVar9[1];
              *plVar9 = (long)paVar10;
              plVar9[1] = 0;
              *(undefined1 *)(plVar9 + 2) = 0;
              std::runtime_error::runtime_error(prVar8,(string *)local_b8);
              *(undefined ***)prVar8 = &PTR__runtime_error_00900168;
              __cxa_throw(prVar8,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
            }
            MeshGeometry_AddColor
                      (this,paVar6,(vector<int,_std::allocator<int>_> *)local_90,pvVar1,
                       (list<aiColor3D,_std::allocator<aiColor3D>_> *)(p_Var7 + 5),
                       *(bool *)&pNodeElement[1].Child.
                                 super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                                 ._M_impl._M_node.super__List_node_base._M_prev);
          }
        }
        p_Var12 = p_Var12->_M_next;
      } while (p_Var12 != (_List_node_base *)plVar13);
    }
    break;
  case ENET_IndexedTriangleSet:
  case ENET_IndexedTriangleFanSet:
  case ENET_IndexedTriangleStripSet:
    plVar13 = &pNodeElement->Child;
    p_Var12 = (pNodeElement->Child).
              super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
              ._M_impl._M_node.super__List_node_base._M_next;
    if (p_Var12 != (_List_node_base *)plVar13) {
      do {
        if (*(int *)&(p_Var12[1]._M_next)->_M_prev == 0x15) {
          paVar6 = GeometryHelper_MakeMesh
                             (this,(vector<int,_std::allocator<int>_> *)
                                   &pNodeElement[1].Child.
                                    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                                    ._M_impl._M_node._M_size,
                              (list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                              (p_Var12[1]._M_next + 5));
          *pMesh = paVar6;
        }
        p_Var12 = p_Var12->_M_next;
      } while (p_Var12 != (_List_node_base *)plVar13);
    }
    p_Var12 = (plVar13->
              super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
              )._M_impl._M_node.super__List_node_base._M_next;
    if (p_Var12 != (_List_node_base *)plVar13) {
      psVar2 = &pNodeElement[1].Child.
                super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                ._M_impl._M_node._M_size;
      local_88 = &pNodeElement[2].Child;
      local_40 = &pNodeElement[2].ID._M_string_length;
      local_90 = (EType *)((long)&pNodeElement[1].ID.field_2 + 8);
      do {
        paVar6 = *pMesh;
        if (paVar6 == (aiMesh *)0x0) {
          __assert_fail("*pMesh",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/X3D/X3DImporter_Postprocess.cpp"
                        ,0x18b,
                        "void Assimp::X3DImporter::Postprocess_BuildMesh(const CX3DImporter_NodeElement &, aiMesh **) const"
                       );
        }
        p_Var7 = p_Var12[1]._M_next;
        iVar3 = *(int *)&p_Var7->_M_prev;
        if (iVar3 < 0x17) {
          if (iVar3 != 0x15) {
            if (iVar3 != 0x16) {
LAB_0063345e:
              prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
              to_string<CX3DImporter_NodeElement::EType>
                        (&local_80,*(EType *)&(p_Var12[1]._M_next)->_M_prev);
              std::operator+(&local_60,
                             "Postprocess_BuildMesh. Unknown child of IndexedTriangleSet or IndexedTriangleFanSet, or \t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\tIndexedTriangleStripSet: "
                             ,&local_80);
              plVar9 = (long *)std::__cxx11::string::append((char *)&local_60);
              local_b8._0_8_ = *plVar9;
              paVar10 = (pointer)(plVar9 + 2);
              if ((pointer)local_b8._0_8_ == paVar10) {
                local_b8._16_8_ = *(undefined8 *)paVar10;
                lStack_a0 = plVar9[3];
                local_b8._0_8_ = (pointer)(local_b8 + 0x10);
              }
              else {
                local_b8._16_8_ = *(undefined8 *)paVar10;
              }
              local_b8._8_8_ = plVar9[1];
              *plVar9 = (long)paVar10;
              plVar9[1] = 0;
              *(undefined1 *)(plVar9 + 2) = 0;
              std::runtime_error::runtime_error(prVar8,(string *)local_b8);
              *(undefined ***)prVar8 = &PTR__runtime_error_00900168;
              __cxa_throw(prVar8,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
            }
            MeshGeometry_AddNormal
                      (this,paVar6,(vector<int,_std::allocator<int>_> *)psVar2,
                       (vector<int,_std::allocator<int>_> *)local_40,
                       (list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)(p_Var7 + 5),
                       *(bool *)&pNodeElement[2].Parent);
          }
        }
        else if (iVar3 == 0x17) {
          MeshGeometry_AddTexCoord
                    (this,paVar6,(vector<int,_std::allocator<int>_> *)psVar2,
                     (vector<int,_std::allocator<int>_> *)local_88,
                     (list<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)(p_Var7 + 5));
        }
        else if (iVar3 == 0x23) {
          MeshGeometry_AddColor
                    (this,paVar6,(vector<int,_std::allocator<int>_> *)psVar2,
                     (vector<int,_std::allocator<int>_> *)local_90,
                     (list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)(p_Var7 + 5),
                     *(bool *)&pNodeElement[1].Child.
                               super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                               ._M_impl._M_node.super__List_node_base._M_prev);
        }
        else {
          if (iVar3 != 0x22) goto LAB_0063345e;
          MeshGeometry_AddColor
                    (this,paVar6,(vector<int,_std::allocator<int>_> *)psVar2,
                     (vector<int,_std::allocator<int>_> *)local_90,
                     (list<aiColor3D,_std::allocator<aiColor3D>_> *)(p_Var7 + 5),
                     *(bool *)&pNodeElement[1].Child.
                               super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                               ._M_impl._M_node.super__List_node_base._M_prev);
        }
        p_Var12 = p_Var12->_M_next;
      } while (p_Var12 != (_List_node_base *)plVar13);
    }
    break;
  case ENET_LineSet:
    plVar13 = &pNodeElement->Child;
    p_Var12 = (pNodeElement->Child).
              super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
              ._M_impl._M_node.super__List_node_base._M_next;
    if (p_Var12 != (_List_node_base *)plVar13) {
      do {
        if (*(int *)&(p_Var12[1]._M_next)->_M_prev == 0x15) {
          paVar6 = GeometryHelper_MakeMesh
                             (this,(vector<int,_std::allocator<int>_> *)
                                   ((long)&pNodeElement[1].ID.field_2 + 8),
                              (list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                              (p_Var12[1]._M_next + 5));
          *pMesh = paVar6;
        }
        p_Var12 = p_Var12->_M_next;
      } while (p_Var12 != (_List_node_base *)plVar13);
    }
    for (p_Var12 = (plVar13->
                   super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                   )._M_impl._M_node.super__List_node_base._M_next;
        p_Var12 != (_List_node_base *)plVar13; p_Var12 = p_Var12->_M_next) {
      paVar6 = *pMesh;
      if (paVar6 == (aiMesh *)0x0) {
        __assert_fail("*pMesh",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/X3D/X3DImporter_Postprocess.cpp"
                      ,0x1e3,
                      "void Assimp::X3DImporter::Postprocess_BuildMesh(const CX3DImporter_NodeElement &, aiMesh **) const"
                     );
      }
      p_Var7 = p_Var12[1]._M_next;
      iVar3 = *(int *)&p_Var7->_M_prev;
      if (iVar3 != 0x15) {
        if (iVar3 == 0x23) {
          MeshGeometry_AddColor
                    (this,paVar6,
                     (list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)(p_Var7 + 5),true
                    );
        }
        else {
          if (iVar3 != 0x22) {
            prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
            to_string<CX3DImporter_NodeElement::EType>
                      (&local_80,*(EType *)&(p_Var12[1]._M_next)->_M_prev);
            std::operator+(&local_60,"Postprocess_BuildMesh. Unknown child of LineSet: ",&local_80);
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_60);
            local_b8._0_8_ = *plVar9;
            paVar10 = (pointer)(plVar9 + 2);
            if ((pointer)local_b8._0_8_ == paVar10) {
              local_b8._16_8_ = *(undefined8 *)paVar10;
              lStack_a0 = plVar9[3];
              local_b8._0_8_ = (pointer)(local_b8 + 0x10);
            }
            else {
              local_b8._16_8_ = *(undefined8 *)paVar10;
            }
            local_b8._8_8_ = plVar9[1];
            *plVar9 = (long)paVar10;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            std::runtime_error::runtime_error(prVar8,(string *)local_b8);
            *(undefined ***)prVar8 = &PTR__runtime_error_00900168;
            __cxa_throw(prVar8,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          MeshGeometry_AddColor
                    (this,paVar6,(list<aiColor3D,_std::allocator<aiColor3D>_> *)(p_Var7 + 5),true);
        }
      }
    }
    break;
  case ENET_PointSet:
    plVar13 = &pNodeElement->Child;
    for (p_Var12 = (pNodeElement->Child).
                   super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                   ._M_impl._M_node.super__List_node_base._M_next;
        p_Var12 != (_List_node_base *)plVar13; p_Var12 = p_Var12->_M_next) {
      if (*(int *)&(p_Var12[1]._M_next)->_M_prev == 0x15) {
        local_b8._0_8_ = (pointer)0x0;
        local_b8._8_8_ = (aiVector3t<float> *)0x0;
        local_b8._16_8_ = (aiVector3t<float> *)0x0;
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
                  ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_b8,
                   (size_type)p_Var12[1]._M_next[6]._M_next);
        p_Var7 = p_Var12[1]._M_next;
        for (p_Var11 = p_Var7[5]._M_next; p_Var11 != p_Var7 + 5; p_Var11 = p_Var11->_M_next) {
          if (local_b8._8_8_ == local_b8._16_8_) {
            std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
            _M_realloc_insert<aiVector3t<float>const&>
                      ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)local_b8,
                       (iterator)local_b8._8_8_,(aiVector3t<float> *)(p_Var11 + 1));
          }
          else {
            *(float *)(local_b8._8_8_ + 8) = *(float *)((long)(p_Var11 + 1) + 8);
            *(_List_node_base **)local_b8._8_8_ = p_Var11[1]._M_next;
            local_b8._8_8_ = local_b8._8_8_ + 0xc;
          }
          p_Var7 = p_Var12[1]._M_next;
        }
        paVar6 = StandardShapes::MakeMesh
                           ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                            local_b8,1);
        *pMesh = paVar6;
        if ((pointer)local_b8._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_b8._0_8_);
        }
      }
    }
    for (p_Var12 = (plVar13->
                   super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                   )._M_impl._M_node.super__List_node_base._M_next;
        p_Var12 != (_List_node_base *)plVar13; p_Var12 = p_Var12->_M_next) {
      paVar6 = *pMesh;
      if (paVar6 == (aiMesh *)0x0) {
        __assert_fail("*pMesh",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/X3D/X3DImporter_Postprocess.cpp"
                      ,0x1c5,
                      "void Assimp::X3DImporter::Postprocess_BuildMesh(const CX3DImporter_NodeElement &, aiMesh **) const"
                     );
      }
      p_Var7 = p_Var12[1]._M_next;
      iVar3 = *(int *)&p_Var7->_M_prev;
      if (iVar3 != 0x15) {
        if (iVar3 == 0x23) {
          MeshGeometry_AddColor
                    (this,paVar6,
                     (list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)(p_Var7 + 5),true
                    );
        }
        else {
          if (iVar3 != 0x22) {
            prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
            to_string<CX3DImporter_NodeElement::EType>
                      (&local_80,*(EType *)&(p_Var12[1]._M_next)->_M_prev);
            std::operator+(&local_60,"Postprocess_BuildMesh. Unknown child of PointSet: ",&local_80)
            ;
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_60);
            local_b8._0_8_ = *plVar9;
            paVar10 = (pointer)(plVar9 + 2);
            if ((pointer)local_b8._0_8_ == paVar10) {
              local_b8._16_8_ = *(undefined8 *)paVar10;
              lStack_a0 = plVar9[3];
              local_b8._0_8_ = (pointer)(local_b8 + 0x10);
            }
            else {
              local_b8._16_8_ = *(undefined8 *)paVar10;
            }
            local_b8._8_8_ = plVar9[1];
            *plVar9 = (long)paVar10;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            std::runtime_error::runtime_error(prVar8,(string *)local_b8);
            *(undefined ***)prVar8 = &PTR__runtime_error_00900168;
            __cxa_throw(prVar8,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          MeshGeometry_AddColor
                    (this,paVar6,(list<aiColor3D,_std::allocator<aiColor3D>_> *)(p_Var7 + 5),true);
        }
      }
    }
    break;
  case ENET_TriangleSet:
    plVar13 = &pNodeElement->Child;
    pCVar5 = pNodeElement;
    pCVar4 = local_38;
    for (p_Var12 = (pNodeElement->Child).
                   super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                   ._M_impl._M_node.super__List_node_base._M_next; local_38 = pCVar5,
        p_Var12 != (_List_node_base *)plVar13; p_Var12 = p_Var12->_M_next) {
      if (*(int *)&(p_Var12[1]._M_next)->_M_prev == 0x15) {
        local_b8._0_8_ = (pointer)0x0;
        local_b8._8_8_ = (aiVector3t<float> *)0x0;
        local_b8._16_8_ = (aiVector3t<float> *)0x0;
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
                  ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_b8,
                   (size_type)p_Var12[1]._M_next[6]._M_next);
        p_Var7 = p_Var12[1]._M_next;
        for (p_Var11 = p_Var7[5]._M_next; p_Var11 != p_Var7 + 5; p_Var11 = p_Var11->_M_next) {
          if (local_b8._8_8_ == local_b8._16_8_) {
            std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
            _M_realloc_insert<aiVector3t<float>const&>
                      ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)local_b8,
                       (iterator)local_b8._8_8_,(aiVector3t<float> *)(p_Var11 + 1));
          }
          else {
            *(float *)(local_b8._8_8_ + 8) = *(float *)((long)(p_Var11 + 1) + 8);
            *(_List_node_base **)local_b8._8_8_ = p_Var11[1]._M_next;
            local_b8._8_8_ = local_b8._8_8_ + 0xc;
          }
          p_Var7 = p_Var12[1]._M_next;
        }
        paVar6 = StandardShapes::MakeMesh
                           ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                            local_b8,3);
        *pMesh = paVar6;
        pNodeElement = local_38;
        if ((pointer)local_b8._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_b8._0_8_);
          pNodeElement = local_38;
        }
      }
      pCVar5 = local_38;
      pCVar4 = local_38;
    }
    p_Var12 = (plVar13->
              super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
              )._M_impl._M_node.super__List_node_base._M_next;
    if (p_Var12 != (_List_node_base *)plVar13) {
      pvVar1 = (vector<int,_std::allocator<int>_> *)((long)&pNodeElement[1].ID.field_2 + 8);
      local_90 = &pNodeElement[2].Type;
      local_88 = (list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_> *)
                 &pNodeElement[1].Child.
                  super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                  ._M_impl._M_node.super__List_node_base._M_prev;
      local_38 = pCVar4;
      do {
        paVar6 = *pMesh;
        if (paVar6 == (aiMesh *)0x0) {
          __assert_fail("*pMesh",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/X3D/X3DImporter_Postprocess.cpp"
                        ,0x22f,
                        "void Assimp::X3DImporter::Postprocess_BuildMesh(const CX3DImporter_NodeElement &, aiMesh **) const"
                       );
        }
        p_Var7 = p_Var12[1]._M_next;
        iVar3 = *(int *)&p_Var7->_M_prev;
        if (iVar3 < 0x17) {
          if (iVar3 != 0x15) {
            if (iVar3 != 0x16) {
LAB_0063375c:
              prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
              to_string<CX3DImporter_NodeElement::EType>
                        (&local_80,*(EType *)&(p_Var12[1]._M_next)->_M_prev);
              std::operator+(&local_60,"Postprocess_BuildMesh. Unknown child of TrianlgeSet: ",
                             &local_80);
              plVar9 = (long *)std::__cxx11::string::append((char *)&local_60);
              local_b8._0_8_ = *plVar9;
              paVar10 = (pointer)(plVar9 + 2);
              if ((pointer)local_b8._0_8_ == paVar10) {
                local_b8._16_8_ = *(undefined8 *)paVar10;
                lStack_a0 = plVar9[3];
                local_b8._0_8_ = (pointer)(local_b8 + 0x10);
              }
              else {
                local_b8._16_8_ = *(undefined8 *)paVar10;
              }
              local_b8._8_8_ = plVar9[1];
              *plVar9 = (long)paVar10;
              plVar9[1] = 0;
              *(undefined1 *)(plVar9 + 2) = 0;
              std::runtime_error::runtime_error(prVar8,(string *)local_b8);
              *(undefined ***)prVar8 = &PTR__runtime_error_00900168;
              __cxa_throw(prVar8,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
            }
            MeshGeometry_AddNormal
                      (this,paVar6,pvVar1,(vector<int,_std::allocator<int>_> *)local_88,
                       (list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)(p_Var7 + 5),
                       (bool)pNodeElement[1].ID.field_2._M_local_buf[3]);
          }
        }
        else if (iVar3 == 0x17) {
          MeshGeometry_AddTexCoord
                    (this,paVar6,pvVar1,(vector<int,_std::allocator<int>_> *)local_90,
                     (list<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)(p_Var7 + 5));
        }
        else if (iVar3 == 0x23) {
          MeshGeometry_AddColor
                    (this,paVar6,
                     (list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)(p_Var7 + 5),
                     (bool)pNodeElement[1].ID.field_2._M_local_buf[2]);
        }
        else {
          if (iVar3 != 0x22) goto LAB_0063375c;
          MeshGeometry_AddColor
                    (this,paVar6,(list<aiColor3D,_std::allocator<aiColor3D>_> *)(p_Var7 + 5),
                     (bool)pNodeElement[1].ID.field_2._M_local_buf[2]);
        }
        p_Var12 = p_Var12->_M_next;
      } while (p_Var12 != (_List_node_base *)plVar13);
    }
    break;
  case ENET_TriangleFanSet:
    plVar13 = &pNodeElement->Child;
    p_Var12 = (pNodeElement->Child).
              super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
              ._M_impl._M_node.super__List_node_base._M_next;
    if (p_Var12 != (_List_node_base *)plVar13) {
      do {
        if (*(int *)&(p_Var12[1]._M_next)->_M_prev == 0x15) {
          paVar6 = GeometryHelper_MakeMesh
                             (this,(vector<int,_std::allocator<int>_> *)
                                   ((long)&pNodeElement[1].ID.field_2 + 8),
                              (list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                              (p_Var12[1]._M_next + 5));
          *pMesh = paVar6;
        }
        p_Var12 = p_Var12->_M_next;
      } while (p_Var12 != (_List_node_base *)plVar13);
    }
    p_Var12 = (plVar13->
              super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
              )._M_impl._M_node.super__List_node_base._M_next;
    if (p_Var12 != (_List_node_base *)plVar13) {
      pvVar1 = (vector<int,_std::allocator<int>_> *)((long)&pNodeElement[1].ID.field_2 + 8);
      local_90 = &pNodeElement[2].Type;
      local_88 = (list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_> *)
                 &pNodeElement[1].Child.
                  super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                  ._M_impl._M_node.super__List_node_base._M_prev;
      do {
        paVar6 = *pMesh;
        if (paVar6 == (aiMesh *)0x0) {
          return;
        }
        p_Var7 = p_Var12[1]._M_next;
        iVar3 = *(int *)&p_Var7->_M_prev;
        if (iVar3 < 0x17) {
          if (iVar3 != 0x15) {
            if (iVar3 != 0x16) {
LAB_006337c9:
              prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
              to_string<CX3DImporter_NodeElement::EType>
                        (&local_80,*(EType *)&(p_Var12[1]._M_next)->_M_prev);
              std::operator+(&local_60,"Postprocess_BuildMesh. Unknown child of TrianlgeFanSet: ",
                             &local_80);
              plVar9 = (long *)std::__cxx11::string::append((char *)&local_60);
              local_b8._0_8_ = *plVar9;
              paVar10 = (pointer)(plVar9 + 2);
              if ((pointer)local_b8._0_8_ == paVar10) {
                local_b8._16_8_ = *(undefined8 *)paVar10;
                lStack_a0 = plVar9[3];
                local_b8._0_8_ = (pointer)(local_b8 + 0x10);
              }
              else {
                local_b8._16_8_ = *(undefined8 *)paVar10;
              }
              local_b8._8_8_ = plVar9[1];
              *plVar9 = (long)paVar10;
              plVar9[1] = 0;
              *(undefined1 *)(plVar9 + 2) = 0;
              std::runtime_error::runtime_error(prVar8,(string *)local_b8);
              *(undefined ***)prVar8 = &PTR__runtime_error_00900168;
              __cxa_throw(prVar8,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
            }
            MeshGeometry_AddNormal
                      (this,paVar6,pvVar1,(vector<int,_std::allocator<int>_> *)local_88,
                       (list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)(p_Var7 + 5),
                       (bool)pNodeElement[1].ID.field_2._M_local_buf[3]);
          }
        }
        else if (iVar3 == 0x17) {
          MeshGeometry_AddTexCoord
                    (this,paVar6,pvVar1,(vector<int,_std::allocator<int>_> *)local_90,
                     (list<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)(p_Var7 + 5));
        }
        else if (iVar3 == 0x23) {
          MeshGeometry_AddColor
                    (this,paVar6,
                     (list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)(p_Var7 + 5),
                     (bool)pNodeElement[1].ID.field_2._M_local_buf[2]);
        }
        else {
          if (iVar3 != 0x22) goto LAB_006337c9;
          MeshGeometry_AddColor
                    (this,paVar6,(list<aiColor3D,_std::allocator<aiColor3D>_> *)(p_Var7 + 5),
                     (bool)pNodeElement[1].ID.field_2._M_local_buf[2]);
        }
        p_Var12 = p_Var12->_M_next;
      } while (p_Var12 != (_List_node_base *)plVar13);
    }
    break;
  case ENET_TriangleStripSet:
    plVar13 = &pNodeElement->Child;
    p_Var12 = (pNodeElement->Child).
              super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
              ._M_impl._M_node.super__List_node_base._M_next;
    if (p_Var12 != (_List_node_base *)plVar13) {
      do {
        if (*(int *)&(p_Var12[1]._M_next)->_M_prev == 0x15) {
          paVar6 = GeometryHelper_MakeMesh
                             (this,(vector<int,_std::allocator<int>_> *)
                                   ((long)&pNodeElement[1].ID.field_2 + 8),
                              (list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                              (p_Var12[1]._M_next + 5));
          *pMesh = paVar6;
        }
        p_Var12 = p_Var12->_M_next;
      } while (p_Var12 != (_List_node_base *)plVar13);
    }
    p_Var12 = (plVar13->
              super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
              )._M_impl._M_node.super__List_node_base._M_next;
    if (p_Var12 != (_List_node_base *)plVar13) {
      pvVar1 = (vector<int,_std::allocator<int>_> *)((long)&pNodeElement[1].ID.field_2 + 8);
      local_90 = &pNodeElement[2].Type;
      local_88 = (list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_> *)
                 &pNodeElement[1].Child.
                  super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                  ._M_impl._M_node.super__List_node_base._M_prev;
      do {
        paVar6 = *pMesh;
        if (paVar6 == (aiMesh *)0x0) {
          __assert_fail("*pMesh",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/X3D/X3DImporter_Postprocess.cpp"
                        ,0x252,
                        "void Assimp::X3DImporter::Postprocess_BuildMesh(const CX3DImporter_NodeElement &, aiMesh **) const"
                       );
        }
        p_Var7 = p_Var12[1]._M_next;
        iVar3 = *(int *)&p_Var7->_M_prev;
        if (iVar3 < 0x17) {
          if (iVar3 != 0x15) {
            if (iVar3 != 0x16) {
LAB_006336ef:
              prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
              to_string<CX3DImporter_NodeElement::EType>
                        (&local_80,*(EType *)&(p_Var12[1]._M_next)->_M_prev);
              std::operator+(&local_60,"Postprocess_BuildMesh. Unknown child of TriangleStripSet: ",
                             &local_80);
              plVar9 = (long *)std::__cxx11::string::append((char *)&local_60);
              local_b8._0_8_ = *plVar9;
              paVar10 = (pointer)(plVar9 + 2);
              if ((pointer)local_b8._0_8_ == paVar10) {
                local_b8._16_8_ = *(undefined8 *)paVar10;
                lStack_a0 = plVar9[3];
                local_b8._0_8_ = (pointer)(local_b8 + 0x10);
              }
              else {
                local_b8._16_8_ = *(undefined8 *)paVar10;
              }
              local_b8._8_8_ = plVar9[1];
              *plVar9 = (long)paVar10;
              plVar9[1] = 0;
              *(undefined1 *)(plVar9 + 2) = 0;
              std::runtime_error::runtime_error(prVar8,(string *)local_b8);
              *(undefined ***)prVar8 = &PTR__runtime_error_00900168;
              __cxa_throw(prVar8,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
            }
            MeshGeometry_AddNormal
                      (this,paVar6,pvVar1,(vector<int,_std::allocator<int>_> *)local_88,
                       (list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)(p_Var7 + 5),
                       (bool)pNodeElement[1].ID.field_2._M_local_buf[3]);
          }
        }
        else if (iVar3 == 0x17) {
          MeshGeometry_AddTexCoord
                    (this,paVar6,pvVar1,(vector<int,_std::allocator<int>_> *)local_90,
                     (list<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)(p_Var7 + 5));
        }
        else if (iVar3 == 0x23) {
          MeshGeometry_AddColor
                    (this,paVar6,
                     (list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)(p_Var7 + 5),
                     (bool)pNodeElement[1].ID.field_2._M_local_buf[2]);
        }
        else {
          if (iVar3 != 0x22) goto LAB_006336ef;
          MeshGeometry_AddColor
                    (this,paVar6,(list<aiColor3D,_std::allocator<aiColor3D>_> *)(p_Var7 + 5),
                     (bool)pNodeElement[1].ID.field_2._M_local_buf[2]);
        }
        p_Var12 = p_Var12->_M_next;
      } while (p_Var12 != (_List_node_base *)plVar13);
    }
  }
  return;
}

Assistant:

void X3DImporter::Postprocess_BuildMesh(const CX3DImporter_NodeElement& pNodeElement, aiMesh** pMesh) const
{
	// check argument
	if(pMesh == nullptr) throw DeadlyImportError("Postprocess_BuildMesh. pMesh is nullptr.");
	if(*pMesh != nullptr) throw DeadlyImportError("Postprocess_BuildMesh. *pMesh must be nullptr.");

	/************************************************************************************************************************************/
	/************************************************************ Geometry2D ************************************************************/
	/************************************************************************************************************************************/
	if((pNodeElement.Type == CX3DImporter_NodeElement::ENET_Arc2D) || (pNodeElement.Type == CX3DImporter_NodeElement::ENET_ArcClose2D) ||
		(pNodeElement.Type == CX3DImporter_NodeElement::ENET_Circle2D) || (pNodeElement.Type == CX3DImporter_NodeElement::ENET_Disk2D) ||
		(pNodeElement.Type == CX3DImporter_NodeElement::ENET_Polyline2D) || (pNodeElement.Type == CX3DImporter_NodeElement::ENET_Polypoint2D) ||
		(pNodeElement.Type == CX3DImporter_NodeElement::ENET_Rectangle2D) || (pNodeElement.Type == CX3DImporter_NodeElement::ENET_TriangleSet2D))
	{
		CX3DImporter_NodeElement_Geometry2D& tnemesh = *((CX3DImporter_NodeElement_Geometry2D*)&pNodeElement);// create alias for convenience
		std::vector<aiVector3D> tarr;

		tarr.reserve(tnemesh.Vertices.size());
		for(std::list<aiVector3D>::iterator it = tnemesh.Vertices.begin(); it != tnemesh.Vertices.end(); ++it) tarr.push_back(*it);
		*pMesh = StandardShapes::MakeMesh(tarr, static_cast<unsigned int>(tnemesh.NumIndices));// create mesh from vertices using Assimp help.

		return;// mesh is build, nothing to do anymore.
	}
	/************************************************************************************************************************************/
	/************************************************************ Geometry3D ************************************************************/
	/************************************************************************************************************************************/
	//
	// Predefined figures
	//
	if((pNodeElement.Type == CX3DImporter_NodeElement::ENET_Box) || (pNodeElement.Type == CX3DImporter_NodeElement::ENET_Cone) ||
		(pNodeElement.Type == CX3DImporter_NodeElement::ENET_Cylinder) || (pNodeElement.Type == CX3DImporter_NodeElement::ENET_Sphere))
	{
		CX3DImporter_NodeElement_Geometry3D& tnemesh = *((CX3DImporter_NodeElement_Geometry3D*)&pNodeElement);// create alias for convenience
		std::vector<aiVector3D> tarr;

		tarr.reserve(tnemesh.Vertices.size());
		for(std::list<aiVector3D>::iterator it = tnemesh.Vertices.begin(); it != tnemesh.Vertices.end(); ++it) tarr.push_back(*it);

		*pMesh = StandardShapes::MakeMesh(tarr, static_cast<unsigned int>(tnemesh.NumIndices));// create mesh from vertices using Assimp help.

		return;// mesh is build, nothing to do anymore.
	}
	//
	// Parametric figures
	//
	if(pNodeElement.Type == CX3DImporter_NodeElement::ENET_ElevationGrid)
	{
		CX3DImporter_NodeElement_ElevationGrid& tnemesh = *((CX3DImporter_NodeElement_ElevationGrid*)&pNodeElement);// create alias for convenience

		// at first create mesh from existing vertices.
		*pMesh = GeometryHelper_MakeMesh(tnemesh.CoordIdx, tnemesh.Vertices);
		// copy additional information from children
		for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)
		{
			if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Color)
				MeshGeometry_AddColor(**pMesh, ((CX3DImporter_NodeElement_Color*)*ch_it)->Value, tnemesh.ColorPerVertex);
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_ColorRGBA)
				MeshGeometry_AddColor(**pMesh, ((CX3DImporter_NodeElement_ColorRGBA*)*ch_it)->Value, tnemesh.ColorPerVertex);
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Normal)
				MeshGeometry_AddNormal(**pMesh,  ((CX3DImporter_NodeElement_Normal*)*ch_it)->Value, tnemesh.NormalPerVertex);
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_TextureCoordinate)
				MeshGeometry_AddTexCoord(**pMesh, ((CX3DImporter_NodeElement_TextureCoordinate*)*ch_it)->Value);
			else
				throw DeadlyImportError("Postprocess_BuildMesh. Unknown child of ElevationGrid: " + to_string((*ch_it)->Type) + ".");
		}// for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)

		return;// mesh is build, nothing to do anymore.
	}// if(pNodeElement.Type == CX3DImporter_NodeElement::ENET_ElevationGrid)
	//
	// Indexed primitives sets
	//
	if(pNodeElement.Type == CX3DImporter_NodeElement::ENET_IndexedFaceSet)
	{
		CX3DImporter_NodeElement_IndexedSet& tnemesh = *((CX3DImporter_NodeElement_IndexedSet*)&pNodeElement);// create alias for convenience

		// at first search for <Coordinate> node and create mesh.
		for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)
		{
			if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Coordinate)
			{
				*pMesh = GeometryHelper_MakeMesh(tnemesh.CoordIndex, ((CX3DImporter_NodeElement_Coordinate*)*ch_it)->Value);
			}
		}

		// copy additional information from children
		for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)
		{
			if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Color)
				MeshGeometry_AddColor(**pMesh, tnemesh.CoordIndex, tnemesh.ColorIndex, ((CX3DImporter_NodeElement_Color*)*ch_it)->Value, tnemesh.ColorPerVertex);
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_ColorRGBA)
				MeshGeometry_AddColor(**pMesh, tnemesh.CoordIndex, tnemesh.ColorIndex, ((CX3DImporter_NodeElement_ColorRGBA*)*ch_it)->Value,
										tnemesh.ColorPerVertex);
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Coordinate)
				{} // skip because already read when mesh created.
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Normal)
				MeshGeometry_AddNormal(**pMesh, tnemesh.CoordIndex, tnemesh.NormalIndex, ((CX3DImporter_NodeElement_Normal*)*ch_it)->Value,
										tnemesh.NormalPerVertex);
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_TextureCoordinate)
				MeshGeometry_AddTexCoord(**pMesh, tnemesh.CoordIndex, tnemesh.TexCoordIndex, ((CX3DImporter_NodeElement_TextureCoordinate*)*ch_it)->Value);
			else
				throw DeadlyImportError("Postprocess_BuildMesh. Unknown child of IndexedFaceSet: " + to_string((*ch_it)->Type) + ".");
		}// for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)

		return;// mesh is build, nothing to do anymore.
	}// if(pNodeElement.Type == CX3DImporter_NodeElement::ENET_IndexedFaceSet)

	if(pNodeElement.Type == CX3DImporter_NodeElement::ENET_IndexedLineSet)
	{
		CX3DImporter_NodeElement_IndexedSet& tnemesh = *((CX3DImporter_NodeElement_IndexedSet*)&pNodeElement);// create alias for convenience

		// at first search for <Coordinate> node and create mesh.
		for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)
		{
			if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Coordinate)
			{
				*pMesh = GeometryHelper_MakeMesh(tnemesh.CoordIndex, ((CX3DImporter_NodeElement_Coordinate*)*ch_it)->Value);
			}
		}

		// copy additional information from children
		for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)
		{
			ai_assert(*pMesh);
			if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Color)
				MeshGeometry_AddColor(**pMesh, tnemesh.CoordIndex, tnemesh.ColorIndex, ((CX3DImporter_NodeElement_Color*)*ch_it)->Value, tnemesh.ColorPerVertex);
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_ColorRGBA)
				MeshGeometry_AddColor(**pMesh, tnemesh.CoordIndex, tnemesh.ColorIndex, ((CX3DImporter_NodeElement_ColorRGBA*)*ch_it)->Value,
										tnemesh.ColorPerVertex);
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Coordinate)
				{} // skip because already read when mesh created.
			else
				throw DeadlyImportError("Postprocess_BuildMesh. Unknown child of IndexedLineSet: " + to_string((*ch_it)->Type) + ".");
		}// for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)

		return;// mesh is build, nothing to do anymore.
	}// if(pNodeElement.Type == CX3DImporter_NodeElement::ENET_IndexedLineSet)

	if((pNodeElement.Type == CX3DImporter_NodeElement::ENET_IndexedTriangleSet) ||
		(pNodeElement.Type == CX3DImporter_NodeElement::ENET_IndexedTriangleFanSet) ||
		(pNodeElement.Type == CX3DImporter_NodeElement::ENET_IndexedTriangleStripSet))
	{
		CX3DImporter_NodeElement_IndexedSet& tnemesh = *((CX3DImporter_NodeElement_IndexedSet*)&pNodeElement);// create alias for convenience

		// at first search for <Coordinate> node and create mesh.
		for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)
		{
			if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Coordinate)
			{
				*pMesh = GeometryHelper_MakeMesh(tnemesh.CoordIndex, ((CX3DImporter_NodeElement_Coordinate*)*ch_it)->Value);
			}
		}

		// copy additional information from children
		for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)
		{
			ai_assert(*pMesh);
			if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Color)
				MeshGeometry_AddColor(**pMesh, tnemesh.CoordIndex, tnemesh.ColorIndex, ((CX3DImporter_NodeElement_Color*)*ch_it)->Value, tnemesh.ColorPerVertex);
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_ColorRGBA)
				MeshGeometry_AddColor(**pMesh, tnemesh.CoordIndex, tnemesh.ColorIndex, ((CX3DImporter_NodeElement_ColorRGBA*)*ch_it)->Value,
										tnemesh.ColorPerVertex);
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Coordinate)
				{} // skip because already read when mesh created.
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Normal)
				MeshGeometry_AddNormal(**pMesh, tnemesh.CoordIndex, tnemesh.NormalIndex, ((CX3DImporter_NodeElement_Normal*)*ch_it)->Value,
										tnemesh.NormalPerVertex);
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_TextureCoordinate)
				MeshGeometry_AddTexCoord(**pMesh, tnemesh.CoordIndex, tnemesh.TexCoordIndex, ((CX3DImporter_NodeElement_TextureCoordinate*)*ch_it)->Value);
			else
				throw DeadlyImportError("Postprocess_BuildMesh. Unknown child of IndexedTriangleSet or IndexedTriangleFanSet, or \
																	IndexedTriangleStripSet: " + to_string((*ch_it)->Type) + ".");
		}// for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)

		return;// mesh is build, nothing to do anymore.
	}// if((pNodeElement.Type == CX3DImporter_NodeElement::ENET_IndexedTriangleFanSet) || (pNodeElement.Type == CX3DImporter_NodeElement::ENET_IndexedTriangleStripSet))

	if(pNodeElement.Type == CX3DImporter_NodeElement::ENET_Extrusion)
	{
		CX3DImporter_NodeElement_IndexedSet& tnemesh = *((CX3DImporter_NodeElement_IndexedSet*)&pNodeElement);// create alias for convenience

		*pMesh = GeometryHelper_MakeMesh(tnemesh.CoordIndex, tnemesh.Vertices);

		return;// mesh is build, nothing to do anymore.
	}// if(pNodeElement.Type == CX3DImporter_NodeElement::ENET_Extrusion)

	//
	// Primitives sets
	//
	if(pNodeElement.Type == CX3DImporter_NodeElement::ENET_PointSet)
	{
		CX3DImporter_NodeElement_Set& tnemesh = *((CX3DImporter_NodeElement_Set*)&pNodeElement);// create alias for convenience

		// at first search for <Coordinate> node and create mesh.
		for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)
		{
			if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Coordinate)
			{
				std::vector<aiVector3D> vec_copy;

				vec_copy.reserve(((CX3DImporter_NodeElement_Coordinate*)*ch_it)->Value.size());
				for(std::list<aiVector3D>::const_iterator it = ((CX3DImporter_NodeElement_Coordinate*)*ch_it)->Value.begin();
					it != ((CX3DImporter_NodeElement_Coordinate*)*ch_it)->Value.end(); ++it)
				{
					vec_copy.push_back(*it);
				}

				*pMesh = StandardShapes::MakeMesh(vec_copy, 1);
			}
		}

		// copy additional information from children
		for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)
		{
			ai_assert(*pMesh);
			if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Color)
				MeshGeometry_AddColor(**pMesh, ((CX3DImporter_NodeElement_Color*)*ch_it)->Value, true);
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_ColorRGBA)
				MeshGeometry_AddColor(**pMesh, ((CX3DImporter_NodeElement_ColorRGBA*)*ch_it)->Value, true);
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Coordinate)
				{} // skip because already read when mesh created.
			else
				throw DeadlyImportError("Postprocess_BuildMesh. Unknown child of PointSet: " + to_string((*ch_it)->Type) + ".");
		}// for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)

		return;// mesh is build, nothing to do anymore.
	}// if(pNodeElement.Type == CX3DImporter_NodeElement::ENET_PointSet)

	if(pNodeElement.Type == CX3DImporter_NodeElement::ENET_LineSet)
	{
		CX3DImporter_NodeElement_Set& tnemesh = *((CX3DImporter_NodeElement_Set*)&pNodeElement);// create alias for convenience

		// at first search for <Coordinate> node and create mesh.
		for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)
		{
			if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Coordinate)
			{
				*pMesh = GeometryHelper_MakeMesh(tnemesh.CoordIndex, ((CX3DImporter_NodeElement_Coordinate*)*ch_it)->Value);
			}
		}

		// copy additional information from children
		for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)
		{
			ai_assert(*pMesh);
			if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Color)
				MeshGeometry_AddColor(**pMesh, ((CX3DImporter_NodeElement_Color*)*ch_it)->Value, true);
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_ColorRGBA)
				MeshGeometry_AddColor(**pMesh, ((CX3DImporter_NodeElement_ColorRGBA*)*ch_it)->Value, true);
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Coordinate)
				{} // skip because already read when mesh created.
			else
				throw DeadlyImportError("Postprocess_BuildMesh. Unknown child of LineSet: " + to_string((*ch_it)->Type) + ".");
		}// for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)

		return;// mesh is build, nothing to do anymore.
	}// if(pNodeElement.Type == CX3DImporter_NodeElement::ENET_LineSet)

	if(pNodeElement.Type == CX3DImporter_NodeElement::ENET_TriangleFanSet)
	{
		CX3DImporter_NodeElement_Set& tnemesh = *((CX3DImporter_NodeElement_Set*)&pNodeElement);// create alias for convenience

		// at first search for <Coordinate> node and create mesh.
		for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)
		{
			if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Coordinate)
			{
				*pMesh = GeometryHelper_MakeMesh(tnemesh.CoordIndex, ((CX3DImporter_NodeElement_Coordinate*)*ch_it)->Value);
			}
		}

		// copy additional information from children
		for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)
		{
			if ( nullptr == *pMesh ) {
				break;
			}
			if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Color)
				MeshGeometry_AddColor(**pMesh, ((CX3DImporter_NodeElement_Color*)*ch_it)->Value,tnemesh.ColorPerVertex);
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_ColorRGBA)
				MeshGeometry_AddColor(**pMesh, ((CX3DImporter_NodeElement_ColorRGBA*)*ch_it)->Value, tnemesh.ColorPerVertex);
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Coordinate)
				{} // skip because already read when mesh created.
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Normal)
				MeshGeometry_AddNormal(**pMesh, tnemesh.CoordIndex, tnemesh.NormalIndex, ((CX3DImporter_NodeElement_Normal*)*ch_it)->Value,
										tnemesh.NormalPerVertex);
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_TextureCoordinate)
				MeshGeometry_AddTexCoord(**pMesh, tnemesh.CoordIndex, tnemesh.TexCoordIndex, ((CX3DImporter_NodeElement_TextureCoordinate*)*ch_it)->Value);
			else
				throw DeadlyImportError("Postprocess_BuildMesh. Unknown child of TrianlgeFanSet: " + to_string((*ch_it)->Type) + ".");
		}// for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)

		return;// mesh is build, nothing to do anymore.
	}// if(pNodeElement.Type == CX3DImporter_NodeElement::ENET_TriangleFanSet)

	if(pNodeElement.Type == CX3DImporter_NodeElement::ENET_TriangleSet)
	{
		CX3DImporter_NodeElement_Set& tnemesh = *((CX3DImporter_NodeElement_Set*)&pNodeElement);// create alias for convenience

		// at first search for <Coordinate> node and create mesh.
		for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)
		{
			if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Coordinate)
			{
				std::vector<aiVector3D> vec_copy;

				vec_copy.reserve(((CX3DImporter_NodeElement_Coordinate*)*ch_it)->Value.size());
				for(std::list<aiVector3D>::const_iterator it = ((CX3DImporter_NodeElement_Coordinate*)*ch_it)->Value.begin();
					it != ((CX3DImporter_NodeElement_Coordinate*)*ch_it)->Value.end(); ++it)
				{
					vec_copy.push_back(*it);
				}

				*pMesh = StandardShapes::MakeMesh(vec_copy, 3);
			}
		}

		// copy additional information from children
		for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)
		{
			ai_assert(*pMesh);
			if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Color)
				MeshGeometry_AddColor(**pMesh, ((CX3DImporter_NodeElement_Color*)*ch_it)->Value, tnemesh.ColorPerVertex);
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_ColorRGBA)
				MeshGeometry_AddColor(**pMesh, ((CX3DImporter_NodeElement_ColorRGBA*)*ch_it)->Value, tnemesh.ColorPerVertex);
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Coordinate)
				{} // skip because already read when mesh created.
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Normal)
				MeshGeometry_AddNormal(**pMesh, tnemesh.CoordIndex, tnemesh.NormalIndex, ((CX3DImporter_NodeElement_Normal*)*ch_it)->Value,
										tnemesh.NormalPerVertex);
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_TextureCoordinate)
				MeshGeometry_AddTexCoord(**pMesh, tnemesh.CoordIndex, tnemesh.TexCoordIndex, ((CX3DImporter_NodeElement_TextureCoordinate*)*ch_it)->Value);
			else
				throw DeadlyImportError("Postprocess_BuildMesh. Unknown child of TrianlgeSet: " + to_string((*ch_it)->Type) + ".");
		}// for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)

		return;// mesh is build, nothing to do anymore.
	}// if(pNodeElement.Type == CX3DImporter_NodeElement::ENET_TriangleSet)

	if(pNodeElement.Type == CX3DImporter_NodeElement::ENET_TriangleStripSet)
	{
		CX3DImporter_NodeElement_Set& tnemesh = *((CX3DImporter_NodeElement_Set*)&pNodeElement);// create alias for convenience

		// at first search for <Coordinate> node and create mesh.
		for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)
		{
			if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Coordinate)
			{
				*pMesh = GeometryHelper_MakeMesh(tnemesh.CoordIndex, ((CX3DImporter_NodeElement_Coordinate*)*ch_it)->Value);
			}
		}

		// copy additional information from children
		for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)
		{
			ai_assert(*pMesh);
			if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Color)
				MeshGeometry_AddColor(**pMesh, ((CX3DImporter_NodeElement_Color*)*ch_it)->Value, tnemesh.ColorPerVertex);
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_ColorRGBA)
				MeshGeometry_AddColor(**pMesh, ((CX3DImporter_NodeElement_ColorRGBA*)*ch_it)->Value, tnemesh.ColorPerVertex);
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Coordinate)
				{} // skip because already read when mesh created.
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Normal)
				MeshGeometry_AddNormal(**pMesh, tnemesh.CoordIndex, tnemesh.NormalIndex, ((CX3DImporter_NodeElement_Normal*)*ch_it)->Value,
										tnemesh.NormalPerVertex);
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_TextureCoordinate)
				MeshGeometry_AddTexCoord(**pMesh, tnemesh.CoordIndex, tnemesh.TexCoordIndex, ((CX3DImporter_NodeElement_TextureCoordinate*)*ch_it)->Value);
			else
				throw DeadlyImportError("Postprocess_BuildMesh. Unknown child of TriangleStripSet: " + to_string((*ch_it)->Type) + ".");
		}// for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)

		return;// mesh is build, nothing to do anymore.
	}// if(pNodeElement.Type == CX3DImporter_NodeElement::ENET_TriangleStripSet)

	throw DeadlyImportError("Postprocess_BuildMesh. Unknown mesh type: " + to_string(pNodeElement.Type) + ".");
}